

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O2

void __thiscall RVO::KdTree::buildAgentTree(KdTree *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator=
            (&this->agents_,&this->sim_->agents_);
  ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar1 != ppAVar2) {
    std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::resize
              (&this->agentTree_,((long)ppAVar2 - (long)ppAVar1 >> 2) - 1);
    buildAgentTreeRecursive
              (this,0,(long)(this->agents_).
                            super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->agents_).
                            super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3,0);
    return;
  }
  return;
}

Assistant:

void KdTree::buildAgentTree()
	{
		agents_ = sim_->agents_;

		if (!agents_.empty()) {
			agentTree_.resize(2 * agents_.size() - 1);
			buildAgentTreeRecursive(0, agents_.size(), 0);
		}
	}